

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

string * __thiscall
antlr::MismatchedTokenException::getMessage_abi_cxx11_(MismatchedTokenException *this)

{
  char *__rhs;
  char *pcVar1;
  long in_RSI;
  string *in_RDI;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> elems;
  string *s;
  ANTLRException *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  string local_410 [32];
  string local_3f0 [20];
  int in_stack_fffffffffffffc24;
  MismatchedTokenException *in_stack_fffffffffffffc28;
  string local_3d0 [36];
  uint local_3ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3a8;
  undefined1 local_389 [33];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  switch(*(undefined4 *)(in_RSI + 0x80)) {
  case 1:
    tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::__cxx11::string::operator+=((string *)this_00,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    break;
  case 2:
    tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::__cxx11::string::operator+=((string *)this_00,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    break;
  case 3:
    tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::__cxx11::string::operator+=((string *)this_00,local_148);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_208);
    break;
  case 4:
    tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
    std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::__cxx11::string::operator+=((string *)this_00,local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
    break;
  case 5:
  case 6:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_389;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,
               (allocator<char> *)in_stack_fffffffffffffbd0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffba0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffba0);
    std::__cxx11::string::operator+=((string *)this_00,local_348);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string((string *)(local_389 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_389);
    BitSet::toArray((BitSet *)in_stack_fffffffffffffbd8);
    local_3ac = 0;
    while( true ) {
      __rhs = (char *)(ulong)local_3ac;
      pcVar1 = (char *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_3a8);
      if (pcVar1 <= __rhs) break;
      std::__cxx11::string::operator+=((string *)this_00," ");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (&local_3a8,(ulong)local_3ac);
      tokenName_abi_cxx11_(in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
      std::__cxx11::string::operator+=((string *)this_00,local_3d0);
      std::__cxx11::string::~string(local_3d0);
      local_3ac = local_3ac + 1;
    }
    std::operator+(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::operator+=((string *)this_00,local_3f0);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_410);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    break;
  default:
    ANTLRException::getMessage_abi_cxx11_(in_stack_fffffffffffffb98);
    std::__cxx11::string::operator=((string *)this_00,(string *)&stack0xfffffffffffffbd0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd0);
  }
  return in_RDI;
}

Assistant:

string MismatchedTokenException::getMessage() const
{
	ANTLR_USE_NAMESPACE(std)string s;
	switch (mismatchType) {
	case TOKEN:
		s += "expecting " + tokenName(expecting) + ", found '" + tokenText + "'";
		break;
	case NOT_TOKEN:
		s += "expecting anything but " + tokenName(expecting) + "; got it anyway";
		break;
	case RANGE:
		s += "expecting token in range: " + tokenName(expecting) + ".." + tokenName(upper) + ", found '" + tokenText + "'";
		break;
	case NOT_RANGE:
		s += "expecting token NOT in range: " + tokenName(expecting) + ".." + tokenName(upper) + ", found '" + tokenText + "'";
		break;
	case SET:
	case NOT_SET:
		{
			s += ANTLR_USE_NAMESPACE(std)string("expecting ") + (mismatchType == NOT_SET ? "NOT " : "") + "one of (";
			ANTLR_USE_NAMESPACE(std)vector<unsigned int> elems = set.toArray();
			for ( unsigned int i = 0; i < elems.size(); i++ )
			{
				s += " ";
				s += tokenName(elems[i]);
			}
			s += "), found '" + tokenText + "'";
		}
		break;
	default:
		s = RecognitionException::getMessage();
		break;
	}
	return s;
}